

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  allocator<char> local_39;
  string local_38;
  Value *local_18;
  Value *value_local;
  string *out_local;
  
  local_18 = value;
  value_local = (Value *)out;
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                                 helper_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                 READ_OK,INVALID_PRESET,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                   ::~function,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                           helper_abi_cxx11_);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::operator()(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                        helper_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       value_local,local_18);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetStringHelper(
  std::string& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::String(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}